

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StyleSheet.cpp
# Opt level: O2

SharedPtr<const_ElementDefinition> __thiscall
Rml::StyleSheet::GetElementDefinition(StyleSheet *this,Element *element)

{
  pointer pbVar1;
  pointer ppEVar2;
  long lVar3;
  pointer ppSVar4;
  pointer ppSVar5;
  bool bVar6;
  int iVar7;
  String *__lhs;
  String *key;
  ElementStyle *this_00;
  StringList *pSVar8;
  ulong uVar9;
  __shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2> *this_01;
  Element *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  pointer ppEVar11;
  long lVar12;
  String *name;
  pointer key_00;
  pointer ppSVar13;
  SharedPtr<const_ElementDefinition> SVar14;
  anon_class_8_1_203d51dc AddApplicableNodes;
  RmlUiAssertNonrecursive rmlui_nonrecursive;
  StyleSheetNode *node;
  anon_class_8_1_203d51dc local_50;
  RmlUiAssertNonrecursive local_48;
  __shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  RmlUiAssertNonrecursive::RmlUiAssertNonrecursive
            (&local_48,&GetElementDefinition::rmlui_nonrecursive_entered);
  if (GetElementDefinition(Rml::Element_const*)::applicable_nodes == '\0') {
    iVar7 = __cxa_guard_acquire(&GetElementDefinition(Rml::Element_const*)::applicable_nodes);
    if (iVar7 != 0) {
      GetElementDefinition::applicable_nodes.
      super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      GetElementDefinition::applicable_nodes.
      super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      GetElementDefinition::applicable_nodes.
      super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __cxa_atexit(::std::
                   vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                   ::~vector,&GetElementDefinition::applicable_nodes,&__dso_handle);
      __cxa_guard_release(&GetElementDefinition(Rml::Element_const*)::applicable_nodes);
    }
  }
  if (GetElementDefinition::applicable_nodes.
      super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      GetElementDefinition::applicable_nodes.
      super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    GetElementDefinition::applicable_nodes.
    super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         GetElementDefinition::applicable_nodes.
         super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  __lhs = Element::GetTagName_abi_cxx11_(in_RDX);
  key = Element::GetId_abi_cxx11_(in_RDX);
  this_00 = Element::GetStyle(in_RDX);
  pSVar8 = ElementStyle::GetClassNameList_abi_cxx11_(this_00);
  bVar6 = ::std::operator==(__lhs,"#text");
  _Var10._M_pi = extraout_RDX;
  if (!bVar6) {
    if (key->_M_string_length != 0) {
      GetElementDefinition::anon_class_8_1_203d51dc::operator()
                (&local_50,(NodeIndex *)&element->offset_parent,key);
    }
    pbVar1 = (pSVar8->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (key_00 = (pSVar8->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; key_00 != pbVar1; key_00 = key_00 + 1)
    {
      GetElementDefinition::anon_class_8_1_203d51dc::operator()
                (&local_50,(NodeIndex *)&element->main_box,key_00);
    }
    GetElementDefinition::anon_class_8_1_203d51dc::operator()
              (&local_50,(NodeIndex *)((element->main_box).area_edges[2] + 2),__lhs);
    ppEVar2 = (element->stacking_context).
              super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    _Var10._M_pi = extraout_RDX_00;
    for (ppEVar11 = (element->stacking_context).
                    super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        ppSVar5 = GetElementDefinition::applicable_nodes.
                  super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
        ppSVar4 = GetElementDefinition::applicable_nodes.
                  super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start, ppEVar11 != ppEVar2;
        ppEVar11 = ppEVar11 + 1) {
      local_40._M_ptr = (element_type *)*ppEVar11;
      bVar6 = StyleSheetNode::IsApplicable((StyleSheetNode *)local_40._M_ptr,in_RDX,(Element *)0x0);
      _Var10._M_pi = extraout_RDX_01;
      if (bVar6) {
        ::std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>::
        push_back(&GetElementDefinition::applicable_nodes,(value_type *)&local_40);
        _Var10._M_pi = extraout_RDX_02;
      }
    }
    if (GetElementDefinition::applicable_nodes.
        super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        GetElementDefinition::applicable_nodes.
        super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar12 = (long)GetElementDefinition::applicable_nodes.
                     super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)GetElementDefinition::applicable_nodes.
                     super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar9 = lVar12 >> 3;
      lVar3 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      ::std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Rml::StyleSheetNode_const**,std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Rml::StyleSheet::GetElementDefinition(Rml::Element_const*)const::__1>>
                (GetElementDefinition::applicable_nodes.
                 super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 GetElementDefinition::applicable_nodes.
                 super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar12 < 0x81) {
        ::std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Rml::StyleSheetNode_const**,std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<Rml::StyleSheet::GetElementDefinition(Rml::Element_const*)const::__1>>
                  (ppSVar4,ppSVar5);
      }
      else {
        ppSVar13 = ppSVar4 + 0x10;
        ::std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Rml::StyleSheetNode_const**,std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<Rml::StyleSheet::GetElementDefinition(Rml::Element_const*)const::__1>>
                  (ppSVar4,ppSVar13);
        for (; ppSVar13 != ppSVar5; ppSVar13 = ppSVar13 + 1) {
          ::std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Rml::StyleSheetNode_const**,std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<Rml::StyleSheet::GetElementDefinition(Rml::Element_const*)const::__1>>
                    (ppSVar13);
        }
      }
      this_01 = &robin_hood::detail::
                 Table<true,80ul,std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>,std::shared_ptr<Rml::ElementDefinition_const>,robin_hood::hash<std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>,void>,std::equal_to<std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>>>
                 ::
                 doCreateByKey<std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>const&,std::shared_ptr<Rml::ElementDefinition_const>>
                           ((Table<true,80ul,std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>,std::shared_ptr<Rml::ElementDefinition_const>,robin_hood::hash<std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>,void>,std::equal_to<std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>>>
                             *)&element->transform_state,&GetElementDefinition::applicable_nodes)->
                 super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>;
      if (this_01->_M_ptr == (element_type *)0x0) {
        ::std::
        make_shared<Rml::ElementDefinition_const,std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>&>
                  ((vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                    *)&local_40);
        ::std::__shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (this_01,&local_40);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      }
      ::std::__shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2> *)this,
                 this_01);
      _Var10._M_pi = extraout_RDX_03;
      goto LAB_002c5951;
    }
  }
  (this->root)._M_t.
  super___uniq_ptr_impl<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_>._M_t.
  super__Tuple_impl<0UL,_Rml::StyleSheetNode_*,_std::default_delete<Rml::StyleSheetNode>_>.
  super__Head_base<0UL,_Rml::StyleSheetNode_*,_false>._M_head_impl = (StyleSheetNode *)0x0;
  *(undefined8 *)&this->specificity_offset = 0;
LAB_002c5951:
  *local_48.entered = false;
  SVar14.super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var10._M_pi;
  SVar14.super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SharedPtr<const_ElementDefinition>)
         SVar14.super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<const ElementDefinition> StyleSheet::GetElementDefinition(const Element* element) const
{
	RMLUI_ASSERT_NONRECURSIVE;

	// Using static to avoid allocations. Make sure we don't call this function recursively.
	static Vector<const StyleSheetNode*> applicable_nodes;
	applicable_nodes.clear();

	auto AddApplicableNodes = [element](const StyleSheetIndex::NodeIndex& node_index, const String& key) {
		auto it_nodes = node_index.find(Hash<String>()(key));
		if (it_nodes != node_index.end())
		{
			const StyleSheetIndex::NodeList& nodes = it_nodes->second;

			for (const StyleSheetNode* node : nodes)
			{
				// We found a node that has at least one requirement matching the element. Now see if we satisfy the remaining requirements of the
				// node, including all ancestor nodes. What this involves is traversing the style nodes backwards, trying to match nodes in the
				// element's hierarchy to nodes in the style hierarchy.
				if (node->IsApplicable(element, nullptr))
					applicable_nodes.push_back(node);
			}
		}
	};

	// See if there are any styles defined for this element.
	const String& tag = element->GetTagName();
	const String& id = element->GetId();
	const StringList& class_names = element->GetStyle()->GetClassNameList();

	// Text elements are never matched.
	if (tag == "#text")
		return nullptr;

	// First, look up the indexed requirements.
	if (!id.empty())
		AddApplicableNodes(styled_node_index.ids, id);

	for (const String& name : class_names)
		AddApplicableNodes(styled_node_index.classes, name);

	AddApplicableNodes(styled_node_index.tags, tag);

	// Also check all remaining nodes that don't contain any indexed requirements.
	for (const StyleSheetNode* node : styled_node_index.other)
	{
		if (node->IsApplicable(element, nullptr))
			applicable_nodes.push_back(node);
	}

	// If this element definition won't actually store any information, don't bother with it.
	if (applicable_nodes.empty())
		return nullptr;

	// Sort the applicable nodes by specificity first, then by pointer value in case we have duplicate specificities.
	std::sort(applicable_nodes.begin(), applicable_nodes.end(), [](const StyleSheetNode* a, const StyleSheetNode* b) {
		const int a_specificity = a->GetSpecificity();
		const int b_specificity = b->GetSpecificity();
		if (a_specificity == b_specificity)
			return a < b;
		return a_specificity < b_specificity;
	});

	// Check if this puppy has already been cached in the node index.
	SharedPtr<const ElementDefinition>& definition = node_cache[applicable_nodes];
	if (!definition)
	{
		// Otherwise, create a new definition and add it to our cache.
		definition = MakeShared<const ElementDefinition>(applicable_nodes);
	}

	return definition;
}